

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

bool __thiscall
CorUnix::CSynchData::CanWaiterWaitWithoutBlocking
          (CSynchData *this,CPalThread *pWaiterThread,bool *pfAbandoned)

{
  LONG LVar1;
  OwnershipSemantics OVar2;
  DWORD DVar3;
  CObjectType *this_00;
  CPalThread *pCVar4;
  bool local_22;
  bool local_21;
  bool fOwnershipTracked;
  bool fAbandoned;
  bool fRetVal;
  bool *pfAbandoned_local;
  CPalThread *pWaiterThread_local;
  CSynchData *this_local;
  
  LVar1 = GetSignalCount(this);
  local_21 = 0 < LVar1;
  local_22 = false;
  this_00 = GetObjectType(this);
  OVar2 = CObjectType::GetOwnershipSemantics(this_00);
  if (local_21) {
    if (OVar2 == OwnershipTracked) {
      local_22 = IsAbandoned(this);
    }
  }
  else if (OVar2 == OwnershipTracked) {
    LVar1 = GetSignalCount(this);
    if ((LVar1 < 1) && (LVar1 = GetOwnershipCount(this), LVar1 < 1)) {
      fprintf(_stderr,"] %s %s:%d","CanWaiterWaitWithoutBlocking",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x3ca);
      fprintf(_stderr,
              "Expression: 0 < GetSignalCount() || 0 < GetOwnershipCount(), Description: Objects with ownership must be either signaled or owned by a thread\n"
             );
    }
    DVar3 = GetOwnerProcessID(this);
    if ((DVar3 == gPID) && (pCVar4 = GetOwnerThread(this), pCVar4 == pWaiterThread)) {
      local_21 = true;
    }
  }
  *pfAbandoned = local_22;
  return local_21;
}

Assistant:

bool CSynchData::CanWaiterWaitWithoutBlocking(
        CPalThread * pWaiterThread,
        bool * pfAbandoned)
    {
        VALIDATEOBJECT(this);
        
        bool fRetVal = (0 < GetSignalCount());
        bool fAbandoned = false;
        bool fOwnershipTracked = (CObjectType::OwnershipTracked == 
                                  GetObjectType()->GetOwnershipSemantics());
        if (fRetVal)            
        {
            // Object signaled: thread can wait without blocking
            if (fOwnershipTracked)
            {
                fAbandoned = IsAbandoned();
            }

            goto CWWWB_exit;
        }

        // Object not signaled: thread can wait without blocking only if the
        // object is an ownable one, and it is owned by the current thread
        if (fOwnershipTracked)
        {
            _ASSERT_MSG(0 < GetSignalCount() || 0 < GetOwnershipCount(),
                        "Objects with ownership must be either signaled or "
                        "owned by a thread\n");
                        
            if ((GetOwnerProcessID() == gPID) && 
                (GetOwnerThread() == pWaiterThread) )
            {
                fRetVal = true;
                goto CWWWB_exit;
            }
        }

    CWWWB_exit:
        *pfAbandoned = fAbandoned;
        return fRetVal;
    }